

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

HRESULT __thiscall WScriptJsrt::ModuleMessage::Call(ModuleMessage *this,LPCSTR fileName)

{
  HRESULT HVar1;
  JsErrorCode jsErrorCode;
  iterator iVar2;
  mapped_type *pmVar3;
  PAL_FILE *stream;
  LPCSTR fileContent_00;
  JsErrorCode JVar4;
  AutoString *pAVar5;
  undefined1 auStack_58 [8];
  AutoString specifierStr;
  JsValueRef result;
  LPCSTR fileContent;
  
  specifierStr.errorCode = JsNoError;
  specifierStr.dontFree = false;
  specifierStr._29_3_ = 0;
  if (this->specifier == (JsValueRef)0x0) {
    pmVar3 = std::
             map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
             ::operator[](&moduleErrMap,&this->moduleRecord);
    JVar4 = JsNoError;
    if ((*pmVar3 != ErroredModule) &&
       (jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtModuleEvaluation)
                                (this->moduleRecord,(JsValueRef *)&specifierStr.errorCode),
       jsErrorCode != JsNoError)) {
      PrintException(fileName,jsErrorCode,(JsValueRef)0x0);
      JVar4 = jsErrorCode;
    }
  }
  else {
    result = (JsValueRef)0x0;
    specifierStr.data._0_5_ = 0;
    specifierStr._13_8_ = 0;
    auStack_58 = (undefined1  [8])0x0;
    specifierStr.length._0_5_ = 0;
    specifierStr.length._5_3_ = 0;
    AutoString::Initialize((AutoString *)auStack_58,this->specifier);
    JVar4 = (JsErrorCode)specifierStr.data_wide;
    if ((JsErrorCode)specifierStr.data_wide == JsNoError) {
      HVar1 = Helpers::LoadScriptFromFile
                        ((LPCSTR)CONCAT35(specifierStr.length._5_3_,(undefined5)specifierStr.length)
                         ,(LPCSTR *)&result,(UINT *)0x0,this->fullPath,true);
      pAVar5 = &specifierStr;
      if (HVar1 < 0) {
        if ((HostConfigFlags::flags.MuteHostErrorMsgIsEnabled == false) &&
           ((iVar2 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                     ::find(&moduleRecordMap_abi_cxx11_._M_t,this->fullPath),
            (_Rb_tree_header *)iVar2._M_node ==
            &moduleRecordMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header ||
            (pmVar3 = std::
                      map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                      ::operator[](&moduleErrMap,(key_type *)(iVar2._M_node + 2)),
            *pmVar3 == RootModule)))) {
          stream = PAL_get_stderr(0);
          PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",
                      CONCAT35(specifierStr.length._5_3_,(undefined5)specifierStr.length));
        }
        if ((AutoString *)this->fullPath != (AutoString *)0x0) {
          pAVar5 = (AutoString *)this->fullPath;
        }
        fileContent_00 = (LPCSTR)0x0;
      }
      else {
        fileContent_00 = (LPCSTR)result;
        if ((AutoString *)this->fullPath != (AutoString *)0x0) {
          pAVar5 = (AutoString *)this->fullPath;
        }
      }
      LoadScript((JsValueRef)0x0,(LPCSTR)pAVar5->length,fileContent_00,"module",true,FinalizeFree,
                 (bool)((byte)~(byte)((uint)HVar1 >> 0x18) >> 7));
    }
    AutoString::~AutoString((AutoString *)auStack_58);
  }
  return JVar4;
}

Assistant:

HRESULT WScriptJsrt::ModuleMessage::Call(LPCSTR fileName)
{
    JsErrorCode errorCode = JsNoError;
    JsValueRef result = JS_INVALID_REFERENCE;
    HRESULT hr;
    if (specifier == nullptr)
    {
        if (moduleErrMap[moduleRecord] != ErroredModule)
        {
            errorCode = ChakraRTInterface::JsModuleEvaluation(moduleRecord, &result);
            if (errorCode != JsNoError)
            {
                PrintException(fileName, errorCode); // this should not be called
            }
        }
    }
    else
    {
        LPCSTR fileContent = nullptr;
        AutoString specifierStr(specifier);
        errorCode = specifierStr.GetError();
        if (errorCode == JsNoError)
        {
            hr = Helpers::LoadScriptFromFile(*specifierStr, fileContent, nullptr, fullPath, true);

            if (FAILED(hr))
            {
                if (!HostConfigFlags::flags.MuteHostErrorMsgIsEnabled)
                {
                    auto actualModuleRecord = moduleRecordMap.find(*fullPath);
                    if (actualModuleRecord == moduleRecordMap.end() || moduleErrMap[actualModuleRecord->second] == RootModule)
                    {
                        fprintf(stderr, "Couldn't load file '%s'\n", specifierStr.GetString());
                    }
                }
                LoadScript(nullptr, fullPath == nullptr ? *specifierStr : fullPath->c_str(), nullptr, "module", true, WScriptJsrt::FinalizeFree, false);
                goto Error;
            }
            LoadScript(nullptr, fullPath == nullptr ? *specifierStr : fullPath->c_str(), fileContent, "module", true, WScriptJsrt::FinalizeFree, true);
        }
    }
Error:
    return errorCode;
}